

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture2DArrayFilteringCase::deinit(Texture2DArrayFilteringCase *this)

{
  Texture2DArray *pTVar1;
  Texture2DArrayFilteringCase *this_local;
  
  pTVar1 = this->m_gradientTex;
  if (pTVar1 != (Texture2DArray *)0x0) {
    glu::Texture2DArray::~Texture2DArray(pTVar1);
    operator_delete(pTVar1,0x70);
  }
  pTVar1 = this->m_gridTex;
  if (pTVar1 != (Texture2DArray *)0x0) {
    glu::Texture2DArray::~Texture2DArray(pTVar1);
    operator_delete(pTVar1,0x70);
  }
  this->m_gradientTex = (Texture2DArray *)0x0;
  this->m_gridTex = (Texture2DArray *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  std::
  vector<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DArrayFilteringCase::FilterCase>_>
  ::clear(&this->m_cases);
  return;
}

Assistant:

void Texture2DArrayFilteringCase::deinit (void)
{
	delete m_gradientTex;
	delete m_gridTex;

	m_gradientTex	= DE_NULL;
	m_gridTex		= DE_NULL;

	m_renderer.clear();
	m_cases.clear();
}